

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O2

void Cut_CellDumpToFile(void)

{
  char cVar1;
  uint uVar2;
  Cut_Cell_t *pCVar3;
  Cut_CMan_t *pCVar4;
  uint uVar5;
  abctime aVar6;
  FILE *__stream;
  abctime aVar7;
  Cut_Cell_t **ppCVar8;
  ulong uVar9;
  int level;
  char *__s;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  int (*__s_00) [5];
  int (*__s_01) [5];
  int aiStack_be8 [588];
  int NumUsed [10] [5];
  int BoxUsed [22] [5];
  
  pCVar4 = s_pCMan;
  __s_01 = NumUsed;
  memset(__s_01,0,200);
  __s_00 = BoxUsed;
  memset(__s_00,0,0x1b8);
  aVar6 = Abc_Clock();
  if (pCVar4 == (Cut_CMan_t *)0x0) {
    __s = "Cut_CellDumpToFile: Cell manager is not defined.";
  }
  else {
    for (uVar5 = 9; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
      ppCVar8 = pCVar4->pSameVar + uVar5;
      while (pCVar3 = *ppCVar8, pCVar3 != (Cut_Cell_t *)0x0) {
        uVar2 = pCVar3->nUsed;
        piVar10 = NumUsed[uVar5];
        if ((((uVar2 != 0) && (piVar10 = NumUsed[uVar5] + 1, 9 < (int)uVar2)) &&
            (piVar10 = NumUsed[uVar5] + 2, 99 < uVar2)) &&
           (piVar10 = NumUsed[uVar5] + 4, uVar2 < 1000)) {
          piVar10 = NumUsed[uVar5] + 3;
        }
        *piVar10 = *piVar10 + 1;
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          cVar1 = pCVar3->Box[lVar11];
          if (uVar2 == 0) {
            piVar10 = BoxUsed[cVar1];
          }
          else if ((int)uVar2 < 10) {
            piVar10 = BoxUsed[cVar1] + 1;
          }
          else if (uVar2 < 100) {
            piVar10 = BoxUsed[cVar1] + 2;
          }
          else if (uVar2 < 1000) {
            piVar10 = BoxUsed[cVar1] + 3;
          }
          else {
            piVar10 = BoxUsed[cVar1] + 4;
          }
          *piVar10 = *piVar10 + 1;
        }
        ppCVar8 = &pCVar3->pNextVar;
      }
    }
    printf("Functions found = %10d.  Functions not found = %10d.\n",(ulong)(uint)pCVar4->nCellFound,
           (ulong)(uint)pCVar4->nCellNotFound);
    for (uVar12 = 0; uVar12 != 10; uVar12 = uVar12 + 1) {
      printf("%3d  : ",uVar12 & 0xffffffff);
      for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
        printf("%8d ",(ulong)(uint)(*__s_01)[lVar11]);
      }
      putchar(10);
      __s_01 = __s_01 + 1;
    }
    puts("Box usage:");
    for (uVar12 = 0; uVar12 != 0x16; uVar12 = uVar12 + 1) {
      printf("%3d  : ",uVar12 & 0xffffffff);
      for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
        printf("%8d ",(ulong)(uint)(*__s_00)[lVar11]);
      }
      printf("  %s",(long)&s_NP3Names_rel + (long)(int)(&s_NP3Names_rel)[uVar12]);
      putchar(10);
      __s_00 = __s_00 + 1;
    }
    __stream = fopen("celllib22.txt","w");
    if (__stream != (FILE *)0x0) {
      uVar5 = 0;
      for (uVar12 = 0; uVar12 != 10; uVar12 = uVar12 + 1) {
        ppCVar8 = pCVar4->pSameVar + uVar12;
        uVar9 = 5;
        if (5 < (uint)uVar12) {
          uVar9 = uVar12 & 0xffffffff;
        }
        while( true ) {
          pCVar3 = *ppCVar8;
          if (pCVar3 == (Cut_Cell_t *)0x0) break;
          if (0 < pCVar3->nUsed) {
            Extra_PrintHexadecimal((FILE *)__stream,pCVar3->uTruth,(int)uVar9);
            fputc(10,__stream);
            uVar5 = uVar5 + 1;
          }
          ppCVar8 = &pCVar3->pNextVar;
        }
        fputc(10,__stream);
      }
      fclose(__stream);
      level = 0x702978;
      printf("Library composed of %d functions is written into file \"%s\".  ",(ulong)uVar5,
             "celllib22.txt");
      Abc_Print(level,"%s =","Time");
      aVar7 = Abc_Clock();
      Abc_Print(level,"%9.2f sec\n",(double)(aVar7 - aVar6) / 1000000.0);
      return;
    }
    __s = "Cut_CellDumpToFile: Cannout open output file.";
  }
  puts(__s);
  return;
}

Assistant:

void Cut_CellDumpToFile()
{
    FILE * pFile;
    Cut_CMan_t * p = s_pCMan;
    Cut_Cell_t * pTemp;
    char * pFileName = "celllib22.txt";
    int NumUsed[10][5] = {{0}};
    int BoxUsed[22][5] = {{0}};
    int i, k, Counter;
    abctime clk = Abc_Clock();

    if ( p == NULL )
    {
        printf( "Cut_CellDumpToFile: Cell manager is not defined.\n" );
        return;
    }

    // count the number of cells used
    for ( k = CUT_CELL_MVAR; k >= 0; k-- )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
        {
            if ( pTemp->nUsed == 0 )
                NumUsed[k][0]++;
            else if ( pTemp->nUsed < 10 )
                NumUsed[k][1]++;
            else if ( pTemp->nUsed < 100 )
                NumUsed[k][2]++;
            else if ( pTemp->nUsed < 1000 )
                NumUsed[k][3]++;
            else 
                NumUsed[k][4]++;

            for ( i = 0; i < 4; i++ )
                if ( pTemp->nUsed == 0 )
                    BoxUsed[ (int)pTemp->Box[i] ][0]++;
                else if ( pTemp->nUsed < 10 )
                    BoxUsed[ (int)pTemp->Box[i] ][1]++;
                else if ( pTemp->nUsed < 100 )
                    BoxUsed[ (int)pTemp->Box[i] ][2]++;
                else if ( pTemp->nUsed < 1000 )
                    BoxUsed[ (int)pTemp->Box[i] ][3]++;
                else 
                    BoxUsed[ (int)pTemp->Box[i] ][4]++;
        }
    }

    printf( "Functions found = %10d.  Functions not found = %10d.\n", p->nCellFound, p->nCellNotFound );
    for ( k = 0; k <= CUT_CELL_MVAR; k++ )
    {
        printf( "%3d  : ", k );
        for ( i = 0; i < 5; i++ ) 
            printf( "%8d ", NumUsed[k][i] );
        printf( "\n" );
    }
    printf( "Box usage:\n" );
    for ( k = 0; k < 22; k++ )
    {
        printf( "%3d  : ", k );
        for ( i = 0; i < 5; i++ ) 
            printf( "%8d ", BoxUsed[k][i] );
        printf( "  %s", s_NP3Names[k] );
        printf( "\n" );
    }

    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cut_CellDumpToFile: Cannout open output file.\n" );
        return;
    }

    Counter = 0;
    for ( k = 0; k <= CUT_CELL_MVAR; k++ )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
            if ( pTemp->nUsed > 0 )
            {
                Extra_PrintHexadecimal( pFile, pTemp->uTruth, (k <= 5? 5 : k) );
                fprintf( pFile, "\n" );
                Counter++;
            }
        fprintf( pFile, "\n" );
    }
    fclose( pFile );

    printf( "Library composed of %d functions is written into file \"%s\".  ", Counter, pFileName );

    ABC_PRT( "Time", Abc_Clock() - clk );
}